

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O0

void __thiscall
Minisat::vec<Minisat::vec<Minisat::Watcher>_>::clear
          (vec<Minisat::vec<Minisat::Watcher>_> *this,bool dealloc)

{
  byte in_SIL;
  long *in_RDI;
  int i;
  int local_10;
  
  if (*in_RDI != 0) {
    for (local_10 = 0; local_10 < (int)in_RDI[1]; local_10 = local_10 + 1) {
      vec<Minisat::Watcher>::~vec((vec<Minisat::Watcher> *)0x14ddce);
    }
    *(undefined4 *)(in_RDI + 1) = 0;
    if ((in_SIL & 1) != 0) {
      free((void *)*in_RDI);
      *in_RDI = 0;
      *(undefined4 *)((long)in_RDI + 0xc) = 0;
    }
  }
  return;
}

Assistant:

void vec<T>::clear(bool dealloc)
{
    if (data != NULL) {
        for (int i = 0; i < sz; i++) data[i].~T();
        sz = 0;
        if (dealloc) free(data), data = NULL, cap = 0;
    }
}